

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.h
# Opt level: O3

void __thiscall
miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::
TimerQueueCallback::~TimerQueueCallback(TimerQueueCallback *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Atomic_word _Var4;
  int iVar5;
  bool bVar6;
  
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__TimerQueueCallback_002ab9e0;
  p_Var2 = (this->info_).
           super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var4 = p_Var2->_M_use_count;
    do {
      if (_Var4 == 0) goto LAB_0020785f;
      LOCK();
      iVar5 = p_Var2->_M_use_count;
      bVar6 = _Var4 == iVar5;
      if (bVar6) {
        p_Var2->_M_use_count = _Var4 + 1;
        iVar5 = _Var4;
      }
      _Var4 = iVar5;
      UNLOCK();
    } while (!bVar6);
    peVar3 = (this->info_).
             super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar3 != (element_type *)0x0 && p_Var2->_M_use_count != 0) {
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)&peVar3->waiting_mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      peVar3->waiting_callbacks = peVar3->waiting_callbacks - 1;
      pthread_mutex_unlock((pthread_mutex_t *)&peVar3->waiting_mutex);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
LAB_0020785f:
    p_Var2 = (this->info_).
             super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var2->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var2->_M_weak_count;
        p_Var2->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var2->_vptr__Sp_counted_base[3])();
        return;
      }
    }
  }
  return;
}

Assistant:

~TimerQueueCallback()
    {
      TimerInfoPtr info = info_.lock();
      if (info)
      {
        std::scoped_lock<std::mutex> lock(info->waiting_mutex);
        --info->waiting_callbacks;
      }
    }